

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O0

int Abc_NtkMfsSolveSat(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  void *pvVar2;
  int local_30;
  int i;
  int RetValue;
  Aig_Obj_t *pObjPo;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  Vec_IntClear(p->vProjVarsSat);
  local_30 = Aig_ManCoNum(p->pAigWin);
  iVar1 = Abc_ObjFaninNum(pNode);
  for (local_30 = local_30 - iVar1; iVar1 = Vec_PtrSize(p->pAigWin->vCos), local_30 < iVar1;
      local_30 = local_30 + 1) {
    pvVar2 = Vec_PtrEntry(p->pAigWin->vCos,local_30);
    if (p->pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)] < 0) {
      __assert_fail("p->pCnf->pVarNums[pObjPo->Id] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsSat.c"
                    ,0x67,"int Abc_NtkMfsSolveSat(Mfs_Man_t *, Abc_Obj_t *)");
    }
    Vec_IntPush(p->vProjVarsSat,p->pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)]);
  }
  iVar1 = Vec_IntSize(p->vProjVarsSat);
  p->nFanins = iVar1;
  iVar1 = Abc_TruthWordNum(p->nFanins);
  p->nWords = iVar1;
  memset(p->uCare,0,(long)p->nWords << 2);
  p->nCares = 0;
  p->nTotConfLim = p->pPars->nBTLimit;
  do {
    iVar1 = Abc_NtkMfsSolveSat_iter(p);
  } while (iVar1 == 1);
  if (iVar1 == -1) {
    p_local._4_4_ = 0;
  }
  else {
    p->nMintsCare = p->nCares + p->nMintsCare;
    p->nMintsTotal = (1 << ((byte)p->nFanins & 0x1f)) + p->nMintsTotal;
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %4d : Care = %2d. Total = %2d.  ",(ulong)(uint)pNode->Id,(ulong)(uint)p->nCares,
             (ulong)(uint)(1 << ((byte)p->nFanins & 0x1f)));
      Extra_PrintBinary(_stdout,p->uCare,1 << ((byte)p->nFanins & 0x1f));
      printf("\n");
    }
    if (p->nFanins < 5) {
      if (p->nFanins == 4) {
        p->uCare[0] = p->uCare[0] | p->uCare[0] << 0x10;
      }
      if (p->nFanins == 3) {
        p->uCare[0] = p->uCare[0] | p->uCare[0] << 8 | p->uCare[0] << 0x10 | p->uCare[0] << 0x18;
      }
      if (p->nFanins == 2) {
        p->uCare[0] = p->uCare[0] | p->uCare[0] << 4 | p->uCare[0] << 8 | p->uCare[0] << 0xc |
                      p->uCare[0] << 0x10 | p->uCare[0] << 0x14 | p->uCare[0] << 0x18 |
                      p->uCare[0] << 0x1c;
      }
      if (p->nFanins == 1) {
        __assert_fail("p->nFanins != 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsSat.c"
                      ,0x8c,"int Abc_NtkMfsSolveSat(Mfs_Man_t *, Abc_Obj_t *)");
      }
      p_local._4_4_ = 1;
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkMfsSolveSat( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Aig_Obj_t * pObjPo;
    int RetValue, i;
    // collect projection variables
    Vec_IntClear( p->vProjVarsSat );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, p->pAigWin->vCos, pObjPo, i, Aig_ManCoNum(p->pAigWin) - Abc_ObjFaninNum(pNode) )
    {
        assert( p->pCnf->pVarNums[pObjPo->Id] >= 0 );
        Vec_IntPush( p->vProjVarsSat, p->pCnf->pVarNums[pObjPo->Id] );
    }

    // prepare the truth table of care set
    p->nFanins = Vec_IntSize( p->vProjVarsSat );
    p->nWords = Abc_TruthWordNum( p->nFanins );
    memset( p->uCare, 0, sizeof(unsigned) * p->nWords );

    // iterate through the SAT assignments
    p->nCares = 0;
    p->nTotConfLim = p->pPars->nBTLimit;
    while ( (RetValue = Abc_NtkMfsSolveSat_iter(p)) == 1 );
    if ( RetValue == -1 )
        return 0;

    // write statistics
    p->nMintsCare  += p->nCares;
    p->nMintsTotal += (1<<p->nFanins);

    if ( p->pPars->fVeryVerbose )
    {
        printf( "Node %4d : Care = %2d. Total = %2d.  ", pNode->Id, p->nCares, (1<<p->nFanins) );
        Extra_PrintBinary( stdout, p->uCare, (1<<p->nFanins) );
        printf( "\n" );
    }

    // map the care 
    if ( p->nFanins > 4 )
        return 1;
    if ( p->nFanins == 4 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] << 16);
    if ( p->nFanins == 3 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] << 8) | (p->uCare[0] << 16) | (p->uCare[0] << 24);
    if ( p->nFanins == 2 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] <<  4) | (p->uCare[0] <<  8) | (p->uCare[0] << 12) |
              (p->uCare[0] << 16) | (p->uCare[0] << 20) | (p->uCare[0] << 24) | (p->uCare[0] << 28);
    assert( p->nFanins != 1 );
    return 1;
}